

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O1

ImmutableSamplerAttribsType * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetImmutableSamplerAttribs
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,Uint32 SampIndex)

{
  char (*in_RCX) [46];
  string msg;
  string local_38;
  
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumImmutableSamplers <= SampIndex) {
    FormatString<char[26],char[46]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SampIndex < this->m_Desc.NumImmutableSamplers",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetImmutableSamplerAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x2c9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return this->m_pImmutableSamplerAttribs + SampIndex;
}

Assistant:

const ImmutableSamplerAttribsType& GetImmutableSamplerAttribs(Uint32 SampIndex) const
    {
        VERIFY_EXPR(SampIndex < this->m_Desc.NumImmutableSamplers);
        return m_pImmutableSamplerAttribs[SampIndex];
    }